

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HumanPlayer.cpp
# Opt level: O2

Card * __thiscall
HumanPlayer::makeDecision
          (HumanPlayer *this,vector<Card_*,_std::allocator<Card_*>_> *available_cards)

{
  pointer ppCVar1;
  Card *c;
  ostream *poVar2;
  long *plVar3;
  vector<Card_*,_std::allocator<Card_*>_> *__range1;
  pointer ppCVar4;
  int iVar5;
  int card_no;
  Erase local_38;
  
  AdvancedConsole::Cursor::Cursor((Cursor *)&card_no,8,0,AC_ABSOLUTE);
  poVar2 = AdvancedConsole::operator<<((ostream *)&std::cout,(Cursor *)&card_no);
  AdvancedConsole::Erase::Erase(&local_38,AC_ALL,AC_LINE);
  poVar2 = AdvancedConsole::operator<<(poVar2,&local_38);
  poVar2 = std::operator<<(poVar2,"It\'s Player ");
  poVar2 = operator<<(poVar2,&this->super_Player);
  poVar2 = std::operator<<(poVar2,"\'s turn.");
  std::endl<char,std::char_traits<char>>(poVar2);
  Player::displayHand(&this->super_Player,9);
  AdvancedConsole::Erase::Erase((Erase *)&card_no,AC_AFTER,AC_SCREEN);
  poVar2 = AdvancedConsole::operator<<((ostream *)&std::cout,(Erase *)&card_no);
  poVar2 = std::operator<<(poVar2,"Playable Cards: ");
  std::endl<char,std::char_traits<char>>(poVar2);
  card_no = -1;
  ppCVar1 = (available_cards->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  iVar5 = 0;
  for (ppCVar4 = (available_cards->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
    c = *ppCVar4;
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = operator<<(poVar2,c);
    std::endl<char,std::char_traits<char>>(poVar2);
    iVar5 = iVar5 + 1;
  }
  do {
    std::operator<<((ostream *)&std::cout,"Play: ");
    plVar3 = (long *)std::istream::operator>>((istream *)&std::cin,&card_no);
    if (-1 < card_no && (*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) == 0) {
      ppCVar4 = (available_cards->super__Vector_base<Card_*,_std::allocator<Card_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)(uint)card_no <
          (ulong)((long)(available_cards->super__Vector_base<Card_*,_std::allocator<Card_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 >> 3)) {
        return ppCVar4[(uint)card_no];
      }
    }
    if (((byte)__gmon_start__[*(long *)(std::cin + -0x18)] & 5) != 0) {
      std::ios::clear((int)*(long *)(std::cin + -0x18) + 0x1222f8);
      std::istream::ignore();
    }
    std::operator<<((ostream *)&std::cout,"Incorrect entry. Try again: ");
  } while( true );
}

Assistant:

Card *HumanPlayer::makeDecision(std::vector<Card *> available_cards) {
    cout << AdvancedConsole::Cursor(8, 0) << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE)
         << "It's Player " << *this << "'s turn." << endl;

    displayHand(9);

    cout << AdvancedConsole::Erase(AdvancedConsole::AC_AFTER) << "Playable Cards: " << endl;
    int i = 0, card_no = -1;
    for (Card *c: available_cards) {
        cout << i++ << ":" << *c << endl;
    }

    while (true) {
        cout << "Play: ";
        if (cin >> card_no && card_no >= 0 && card_no < available_cards.size()) {
            break;
        } else if (cin.fail()) {
            cin.clear();
            cin.ignore();
        }
        cout << "Incorrect entry. Try again: ";
    }

    Card *card = available_cards[card_no];
    return card;
}